

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O2

void __thiscall
TEST_GlobalMemoryAccountant_reportWithCacheSizes_Test::
~TEST_GlobalMemoryAccountant_reportWithCacheSizes_Test
          (TEST_GlobalMemoryAccountant_reportWithCacheSizes_Test *this)

{
  TEST_GROUP_CppUTestGroupGlobalMemoryAccountant::~TEST_GROUP_CppUTestGroupGlobalMemoryAccountant
            (&this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant);
  operator_delete(this,0x98);
  return;
}

Assistant:

TEST(GlobalMemoryAccountant, reportWithCacheSizes)
{
    size_t cacheSizes[] = {512};
    accountant.useCacheSizes(cacheSizes, 1);
    accountant.start();
    char* memory = new char[185];
    delete [] memory;
    accountant.stop();

    /* Allocation includes memory leak info */
    STRCMP_CONTAINS("512                   1                1                 1", accountant.report().asCharString());
}